

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

time_t __thiscall ON_XMLVariant::AsTime(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  int iVar2;
  wchar_t *__nptr;
  long lVar3;
  long lVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  tm local_68;
  
  pOVar1 = this->_private;
  if (pOVar1->_type == Time) {
    dVar5 = (pOVar1->field_2)._double_val;
  }
  else if (pOVar1->_type == String) {
    iVar2 = ON_wString::Length(&pOVar1->_string_val);
    iVar6 = 0;
    iVar9 = 0;
    local_68.tm_mday = 0;
    uVar8 = 0;
    uVar7 = 0;
    local_68.tm_sec = 0;
    bVar10 = false;
    if (iVar2 == 0x13) {
      __nptr = ON_wString::operator_cast_to_wchar_t_(&pOVar1->_string_val);
      iVar6 = 0;
      iVar9 = 0;
      local_68.tm_mday = 0;
      uVar8 = 0;
      uVar7 = 0;
      local_68.tm_sec = 0;
      bVar10 = false;
      if (__nptr[4] == L'.') {
        iVar6 = 0;
        iVar9 = 0;
        local_68.tm_mday = 0;
        uVar8 = 0;
        uVar7 = 0;
        local_68.tm_sec = 0;
        bVar10 = false;
        if (__nptr[7] == L'.') {
          iVar6 = 0;
          iVar9 = 0;
          local_68.tm_mday = 0;
          uVar8 = 0;
          uVar7 = 0;
          local_68.tm_sec = 0;
          bVar10 = false;
          if (__nptr[10] == L'_') {
            iVar6 = 0;
            iVar9 = 0;
            local_68.tm_mday = 0;
            uVar8 = 0;
            uVar7 = 0;
            local_68.tm_sec = 0;
            bVar10 = false;
            if (__nptr[0xd] == L':') {
              iVar6 = 0;
              iVar9 = 0;
              local_68.tm_mday = 0;
              uVar8 = 0;
              uVar7 = 0;
              local_68.tm_sec = 0;
              bVar10 = false;
              if (__nptr[0x10] == L':') {
                bVar10 = false;
                lVar3 = wcstol(__nptr,(wchar_t **)0x0,10);
                iVar6 = (int)lVar3;
                lVar3 = wcstol(__nptr + 5,(wchar_t **)0x0,10);
                iVar9 = (int)lVar3;
                lVar3 = wcstol(__nptr + 8,(wchar_t **)0x0,10);
                lVar4 = wcstol(__nptr + 0xb,(wchar_t **)0x0,10);
                uVar8 = (uint)lVar4;
                lVar4 = wcstol(__nptr + 0xe,(wchar_t **)0x0,10);
                uVar7 = (uint)lVar4;
                lVar4 = wcstol(__nptr + 0x11,(wchar_t **)0x0,10);
                local_68.tm_sec = (int)lVar4;
                local_68.tm_mday = (int)lVar3;
                if (0xfffffff3 < iVar9 - 0xdU && 0xfffffda6 < iVar6 - 0x9c5U) {
                  bVar10 = (uint)local_68.tm_sec < 0x3c &&
                           ((uVar7 < 0x3c && uVar8 < 0x18) && local_68.tm_mday - 1U < 0x1f);
                }
              }
            }
          }
        }
      }
    }
    dVar5 = -NAN;
    if (bVar10) {
      local_68.tm_wday = 0;
      local_68.tm_yday = 0;
      local_68.tm_gmtoff = 0;
      local_68.tm_zone = (char *)0x0;
      local_68.tm_year = iVar6 + -0x76c;
      local_68.tm_mon = iVar9 + -1;
      local_68.tm_hour = uVar8;
      local_68.tm_min = uVar7;
      local_68.tm_isdst = -1;
      local_68._36_4_ = 0;
      dVar5 = (double)mktime(&local_68);
    }
  }
  else {
    dVar5 = 0.0;
  }
  return (time_t)dVar5;
}

Assistant:

time_t ON_XMLVariant::AsTime(void) const
{
  switch (_private->_type)
  {
  case Types::String:
    return TimeFromString(_private->_string_val);

  case Types::Time:
    return _private->_time_val;
          
  default: return 0;
  }
}